

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Texturing.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Texturing_ImageTexture(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var9;
  CX3DImporter_NodeElement *pParentElement;
  string *psVar10;
  int pAttrIdx;
  ulong uVar11;
  CX3DImporter_NodeElement *ne;
  string an;
  string def;
  string use;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  url;
  bool local_bb;
  bool local_ba;
  allocator local_b9;
  CX3DImporter_NodeElement *local_b8;
  uint local_ac;
  string local_a8;
  string local_88;
  string local_68;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined4 extraout_var_00;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node._M_size = 0;
  local_b8 = (CX3DImporter_NodeElement *)0x0;
  local_48._M_impl._M_node.super__List_node_base._M_prev =
       local_48._M_impl._M_node.super__List_node_base._M_next;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar7 < 1) {
    local_bb = true;
    local_ba = true;
  }
  else {
    uVar11 = 0;
    local_ba = true;
    local_bb = true;
    local_ac = uVar7;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar11;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar11);
      std::__cxx11::string::string
                ((string *)&local_a8,(char *)CONCAT44(extraout_var,iVar8),&local_b9);
      iVar8 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar8);
        psVar10 = &local_88;
LAB_0062f45e:
        pcVar3 = (char *)psVar10->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar3,(ulong)__s);
        uVar7 = local_ac;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar8);
          psVar10 = &local_68;
          goto LAB_0062f45e;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_a8);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_a8), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)&local_a8), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)&local_a8);
          if (iVar8 == 0) {
            local_ba = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_a8);
            if (iVar8 == 0) {
              local_bb = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)&local_a8);
              if (iVar8 == 0) {
                XML_ReadNode_GetAttrVal_AsListS
                          (this,pAttrIdx,
                           (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_48);
              }
              else {
                Throw_IncorrectAttr(this,&local_a8);
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      uVar11 = (ulong)(pAttrIdx + 1U);
    } while (uVar7 != pAttrIdx + 1U);
  }
  if (local_68._M_string_length == 0) {
    pParentElement = (CX3DImporter_NodeElement *)operator_new(0x78);
    pCVar4 = this->NodeElement_Cur;
    pParentElement->Type = ENET_ImageTexture;
    (pParentElement->ID)._M_dataplus._M_p = (pointer)&(pParentElement->ID).field_2;
    (pParentElement->ID)._M_string_length = 0;
    (pParentElement->ID).field_2._M_local_buf[0] = '\0';
    pParentElement->Parent = pCVar4;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pParentElement->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_ImageTexture_00938108;
    *(size_type **)&pParentElement[1].Type = &pParentElement[1].ID._M_string_length;
    pParentElement[1].ID._M_dataplus._M_p = (pointer)0x0;
    *(undefined1 *)&pParentElement[1].ID._M_string_length = 0;
    local_b8 = pParentElement;
    if (local_88._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&pParentElement->ID);
    }
    *(bool *)&pParentElement[1]._vptr_CX3DImporter_NodeElement = local_ba;
    *(bool *)((long)&pParentElement[1]._vptr_CX3DImporter_NodeElement + 1) = local_bb;
    if (local_48._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_48) {
      std::__cxx11::string::_M_replace
                ((ulong)&pParentElement[1].Type,0,pParentElement[1].ID._M_dataplus._M_p,0x71872f);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&pParentElement[1].Type);
    }
    iVar8 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar8 == '\0') {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ImageTexture","");
      ParseNode_Metadata(this,pParentElement,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)pParentElement;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)pParentElement;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_88._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_68,ENET_ImageTexture,&local_b8);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_68);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_b8;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &pCVar4->Child;
  }
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Texturing_ImageTexture()
{
    std::string use, def;
    bool repeatS = true;
    bool repeatT = true;
    std::list<std::string> url;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("repeatS", repeatS, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("repeatT", repeatT, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("url", url, XML_ReadNode_GetAttrVal_AsListS);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_ImageTexture, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_ImageTexture(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_ImageTexture*)ne)->RepeatS = repeatS;
		((CX3DImporter_NodeElement_ImageTexture*)ne)->RepeatT = repeatT;
		// Attribute "url" can contain list of strings. But we need only one - first.
		if(!url.empty())
			((CX3DImporter_NodeElement_ImageTexture*)ne)->URL = url.front();
		else
			((CX3DImporter_NodeElement_ImageTexture*)ne)->URL = "";

		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "ImageTexture");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}